

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  bool bVar1;
  char *pcVar2;
  pointer ppcVar3;
  cmListFile listFile;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  string currentStart;
  string filesDir;
  BuildsystemFileScope scope;
  
  BuildsystemFileScope::BuildsystemFileScope(&scope,this);
  cmState::Snapshot::GetDirectory((Directory *)&subdirs,&this->StateSnapshot);
  pcVar2 = cmState::Directory::GetCurrentBinary((Directory *)&subdirs);
  std::__cxx11::string::string((string *)&filesDir,pcVar2,(allocator *)&currentStart);
  std::__cxx11::string::append((char *)&filesDir);
  cmsys::SystemTools::MakeDirectory(filesDir._M_dataplus._M_p);
  cmState::Snapshot::GetDirectory((Directory *)&subdirs,&this->StateSnapshot);
  pcVar2 = cmState::Directory::GetCurrentSource((Directory *)&subdirs);
  std::__cxx11::string::string((string *)&currentStart,pcVar2,(allocator *)&listFile);
  std::__cxx11::string::append((char *)&currentStart);
  bVar1 = cmsys::SystemTools::FileExists(currentStart._M_dataplus._M_p,true);
  if (bVar1) {
    std::__cxx11::string::string((string *)&subdirs,"CMAKE_PARENT_LIST_FILE",(allocator *)&listFile)
    ;
    AddDefinition(this,(string *)&subdirs,currentStart._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&subdirs);
    listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmParseFileScope::cmParseFileScope((cmParseFileScope *)&subdirs,this);
    bVar1 = IsRootMakefile(this);
    bVar1 = cmListFile::ParseFile(&listFile,currentStart._M_dataplus._M_p,bVar1,this);
    cmParseFileScope::~cmParseFileScope((cmParseFileScope *)&subdirs);
    if (bVar1) {
      ReadListFile(this,&listFile,&currentStart);
      bVar1 = cmSystemTools::GetFatalErrorOccured();
      if (bVar1) {
        scope.ReportError = false;
      }
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
                (&subdirs,&this->UnConfiguredDirectories);
      for (ppcVar3 = subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          ppcVar3 !=
          subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
        cmState::Snapshot::InitializeFromParent_ForSubdirsCommand(&(*ppcVar3)->StateSnapshot);
        ConfigureSubDirectory(this,*ppcVar3);
      }
      AddCMakeDependFilesFromUser(this);
      std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
                (&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
    }
    std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
              (&listFile.Functions);
    std::__cxx11::string::~string((string *)&currentStart);
    std::__cxx11::string::~string((string *)&filesDir);
    BuildsystemFileScope::~BuildsystemFileScope(&scope);
    return;
  }
  __assert_fail("cmSystemTools::FileExists(currentStart.c_str(), true)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmMakefile.cxx"
                ,0x676,"void cmMakefile::Configure()");
}

Assistant:

void cmMakefile::Configure()
{
  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += cmake::GetCMakeFilesDirectory();
  cmSystemTools::MakeDirectory(filesDir.c_str());

  std::string currentStart =
      this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";
  assert(cmSystemTools::FileExists(currentStart.c_str(), true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  {
  cmParseFileScope pfs(this);
  if (!listFile.ParseFile(currentStart.c_str(), this->IsRootMakefile(), this))
    {
    return;
    }
  }
  this->ReadListFile(listFile, currentStart);
  if(cmSystemTools::GetFatalErrorOccured())
    {
    scope.Quiet();
    }

   // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi)
    {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
    }

  this->AddCMakeDependFilesFromUser();
}